

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O0

bool __thiscall
TransitionObservationIndependentMADPDiscrete::SetInitialized
          (TransitionObservationIndependentMADPDiscrete *this,bool b)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  undefined8 uVar4;
  ulong uVar5;
  pointer puVar6;
  size_t *psVar7;
  byte in_SIL;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  TransitionObservationIndependentMADPDiscrete *in_stack_00000020;
  iterator last;
  iterator it;
  TransitionObservationIndependentMADPDiscrete *in_stack_000000e0;
  vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
  *in_stack_ffffffffffffff58;
  TransitionObservationIndependentMADPDiscrete *in_stack_ffffffffffffff60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff88;
  E *in_stack_ffffffffffffff90;
  TransitionObservationIndependentMADPDiscrete *in_stack_ffffffffffffffa0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<MultiAgentDecisionProcessDiscrete_**,_std::vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>_>
  local_30 [2];
  TransitionObservationIndependentMADPDiscrete *in_stack_ffffffffffffffe0;
  
  bVar1 = in_SIL & 1;
  if (bVar1 == 0) {
    if ((((ulong)in_RDI[8].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish & 1) == 1) &&
       (puVar6 = in_RDI[0xc].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish, puVar6 != (pointer)0x0)) {
      operator_delete__(puVar6);
    }
    *(undefined1 *)
     &in_RDI[8].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = 0;
  }
  else {
    if (((((ulong)in_RDI[8].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish & 1) == 1) && (bVar1 == 1)) &&
       (in_stack_ffffffffffffff60 =
             (TransitionObservationIndependentMADPDiscrete *)
             in_RDI[0xc].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish,
       in_stack_ffffffffffffff60 != (TransitionObservationIndependentMADPDiscrete *)0x0)) {
      operator_delete__(in_stack_ffffffffffffff60);
    }
    lVar3 = (*(code *)(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start[2])();
    if (lVar3 == 0) {
      uVar4 = __cxa_allocate_exception(0x28);
      E::E(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      __cxa_throw(uVar4,&E::typeinfo,E::~E);
    }
    if (bVar1 == 1) {
      local_30[0]._M_current =
           (MultiAgentDecisionProcessDiscrete **)
           std::
           vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
           ::begin(in_stack_ffffffffffffff58);
      std::
      vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
      ::end(in_stack_ffffffffffffff58);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<MultiAgentDecisionProcessDiscrete_**,_std::vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>_>
                                 *)in_stack_ffffffffffffff60,
                                (__normal_iterator<MultiAgentDecisionProcessDiscrete_**,_std::vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>_>
                                 *)in_stack_ffffffffffffff58), bVar2) {
        __gnu_cxx::
        __normal_iterator<MultiAgentDecisionProcessDiscrete_**,_std::vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>_>
        ::operator*(local_30);
        MultiAgentDecisionProcessDiscrete::Initialize((MultiAgentDecisionProcessDiscrete *)0xab8a57)
        ;
        __gnu_cxx::
        __normal_iterator<MultiAgentDecisionProcessDiscrete_**,_std::vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>_>
        ::operator++((__normal_iterator<MultiAgentDecisionProcessDiscrete_**,_std::vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>_>
                      *)in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      }
      uVar5 = (*(code *)(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data._M_start[2])();
      if (uVar5 < 4) {
        *(undefined1 *)
         ((long)&in_RDI[8].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 2) = 1;
      }
      CreateJointActions(in_stack_ffffffffffffffe0);
      CreateJointStates(in_stack_000000e0);
      CreateJointObservations(in_stack_00000020);
      CreateISD(in_stack_00000020);
      puVar6 = (pointer)(*(code *)(in_RDI->
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[2])();
      in_RDI[8].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar6;
      psVar7 = IndexTools::CalculateStepSize(in_stack_ffffffffffffff68);
      in_RDI[0xc].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = psVar7;
      IndexTools::CalculateStepSizeVector(in_stack_ffffffffffffffb8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (in_RDI,in_stack_ffffffffffffff68);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_RDI);
      IndexTools::CalculateStepSizeVector(in_stack_ffffffffffffffb8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (in_RDI,in_stack_ffffffffffffff68);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_RDI);
      IndexTools::CalculateStepSizeVector(in_stack_ffffffffffffffb8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (in_RDI,in_stack_ffffffffffffff68);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_RDI);
      *(undefined1 *)
       &in_RDI[8].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = 1;
      if (((ulong)in_RDI[8].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish & 0x1000000) != 0) {
        if (((ulong)in_RDI[8].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish & 0x100) == 0) {
          CreateCentralizedFullModels(in_stack_ffffffffffffffa0);
        }
        else {
          CreateCentralizedSparseModels(in_stack_ffffffffffffff60);
        }
      }
    }
  }
  return true;
}

Assistant:

bool TransitionObservationIndependentMADPDiscrete::SetInitialized(bool b)
{
    if(b == false)
    {
        if(_m_initialized == true)
            delete [] _m_actionStepSizeArray;
        _m_initialized = false;
        return(true);
    }
   if(_m_initialized == true && b == true)
   {
       //first free mem before re-initialize:
       delete [] _m_actionStepSizeArray;
   }

    if(DEBUG_TOIMADPD)
        cerr << "TransitionObservationIndependentMADPDiscrete::SetInitialized"<<
        " called - GetNrAgents()="<< GetNrAgents()<<endl;
    
    if(GetNrAgents() < 1 )
        throw E("TransitionObservationIndependentMADPDiscrete::SetInitialized(bool b) called, but the number of agents has not been set yet.. (is 0 at the moment...)");

    if(b == true)
    {
        //first initialize the individual models... 
        vector<MultiAgentDecisionProcessDiscrete*>::iterator it = 
            _m_individualMADPDs.begin();
        vector<MultiAgentDecisionProcessDiscrete*>::iterator last = 
            _m_individualMADPDs.end();
        while(it != last)
        {
            (*it)->Initialize();
            it++;
        }

        // for three agents or less we cache the joint indices
        if(GetNrAgents()<=3)
            _m_jointIndicesCached=true;

        //now perform the necessary actions for this class...
        CreateJointActions();
        CreateJointStates();
        CreateJointObservations();
        
        CreateISD();

        _m_nr_agents=GetNrAgents();
        _m_actionStepSizeArray=IndexTools::CalculateStepSize(_m_nrIndivActions);
        _m_actionStepSize=IndexTools::CalculateStepSizeVector(_m_nrIndivActions);
        _m_observationStepSize=IndexTools::CalculateStepSizeVector(_m_nrIndivObs);
        _m_stateStepSize=IndexTools::CalculateStepSizeVector(_m_nrIndivStates);

        _m_initialized = b;

        if(_m_jointModelsGenerated)
        {
            if(_m_sparse)
                CreateCentralizedSparseModels();
            else
                CreateCentralizedFullModels();
        }


    }
    return(true);
}